

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

string * __thiscall
re2::NFA::FormatCapture_abi_cxx11_(string *__return_storage_ptr__,NFA *this,char **capture)

{
  int iVar1;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  paVar4 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < this->ncapture_) {
    lVar3 = 0;
    do {
      if (capture[lVar3] == (char *)0x0) {
        StringAppendF(__return_storage_ptr__,"(?,?)");
      }
      else {
        iVar1 = (int)this->btext_;
        uVar2 = (ulong)(uint)((int)capture[lVar3] - iVar1);
        if (capture[lVar3 + 1] == (char *)0x0) {
          StringAppendF(__return_storage_ptr__,"(%d,?)",uVar2);
        }
        else {
          StringAppendF(__return_storage_ptr__,"(%d,%d)",uVar2,
                        (ulong)(uint)((int)capture[lVar3 + 1] - iVar1),in_R8,in_R9,paVar4);
        }
      }
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < this->ncapture_);
  }
  return __return_storage_ptr__;
}

Assistant:

string NFA::FormatCapture(const char** capture) {
  string s;

  for (int i = 0; i < ncapture_; i+=2) {
    if (capture[i] == NULL)
      StringAppendF(&s, "(?,?)");
    else if (capture[i+1] == NULL)
      StringAppendF(&s, "(%d,?)", (int)(capture[i] - btext_));
    else
      StringAppendF(&s, "(%d,%d)",
                    (int)(capture[i] - btext_),
                    (int)(capture[i+1] - btext_));
  }
  return s;
}